

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void prvTidyReportNumWarnings(TidyDocImpl *doc)

{
  uint quantity;
  uint quantity_00;
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  ctmbstr ptVar3;
  char *msg;
  
  if ((doc->warnings == 0) && (doc->errors == 0)) {
    ptVar1 = tidyLocalizedString(0x80d);
    msg = "%s\n\n";
  }
  else {
    ptVar1 = tidyLocalizedString(0x807);
    quantity = doc->warnings;
    ptVar2 = tidyLocalizedStringN(0x809,quantity);
    quantity_00 = doc->errors;
    ptVar3 = tidyLocalizedStringN(0x808,quantity_00);
    tidy_out(doc,ptVar1,(ulong)quantity,ptVar2,(ulong)quantity_00,ptVar3);
    if (((ulong)doc->errors <= (doc->config).value[0x46].v) &&
       (*(int *)((doc->config).value + 0x12) != 0)) {
      tidy_out(doc,anon_var_dwarf_188a9 + 0x15c);
      return;
    }
    ptVar1 = tidyLocalizedString(0x80f);
    msg = " %s\n\n";
  }
  tidy_out(doc,msg,ptVar1);
  return;
}

Assistant:

void TY_(ReportNumWarnings)( TidyDocImpl* doc )
{
    if ( doc->warnings > 0 || doc->errors > 0 )
    {
        tidy_out( doc, tidyLocalizedString(STRING_ERROR_COUNT),
                  doc->warnings, tidyLocalizedStringN( STRING_ERROR_COUNT_WARNING, doc->warnings ),
                  doc->errors, tidyLocalizedStringN( STRING_ERROR_COUNT_ERROR, doc->errors ) );

        if ( doc->errors > cfg(doc, TidyShowErrors) ||
             !cfgBool(doc, TidyShowWarnings) )
            tidy_out( doc, " %s\n\n", tidyLocalizedString(STRING_NOT_ALL_SHOWN) );
        else
            tidy_out( doc, "\n\n" );
    }
    else
        tidy_out( doc, "%s\n\n", tidyLocalizedString(STRING_NO_ERRORS) );
}